

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::srem(APInt *this,APInt *RHS)

{
  bool bVar1;
  bool bVar2;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  APInt *this_00;
  APInt *this_01;
  APInt AVar4;
  APInt local_b0;
  APInt local_a0;
  APInt local_90;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  undefined8 uVar3;
  
  bVar1 = isNegative(RHS);
  bVar2 = isNegative(in_RDX);
  if (bVar1) {
    if (bVar2) {
      this_01 = &local_50;
      APInt(this_01,RHS);
      operator-((llvm *)&local_b0,this_01);
      this_00 = &local_70;
      APInt(this_00,in_RDX);
      operator-((llvm *)&local_60,this_00);
      urem(&local_40,&local_b0);
      operator-((llvm *)this,&local_40);
      ~APInt(&local_40);
      ~APInt(&local_60);
    }
    else {
      this_01 = &local_90;
      APInt(this_01,RHS);
      operator-((llvm *)&local_b0,this_01);
      this_00 = &local_80;
      urem(this_00,&local_b0);
      operator-((llvm *)this,this_00);
    }
    ~APInt(this_00);
  }
  else {
    if (!bVar2) {
      AVar4 = urem(this,RHS);
      uVar3 = AVar4._8_8_;
      goto LAB_001618a6;
    }
    this_01 = &local_a0;
    APInt(this_01,in_RDX);
    operator-((llvm *)&local_b0,this_01);
    urem(this,RHS);
  }
  ~APInt(&local_b0);
  ~APInt(this_01);
  uVar3 = extraout_RDX;
LAB_001618a6:
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::srem(const APInt &RHS) const {
  if (isNegative()) {
    if (RHS.isNegative())
      return -((-(*this)).urem(-RHS));
    return -((-(*this)).urem(RHS));
  }
  if (RHS.isNegative())
    return this->urem(-RHS);
  return this->urem(RHS);
}